

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

void __thiscall
tinygltf::PbrMetallicRoughness::PbrMetallicRoughness
          (PbrMetallicRoughness *this,PbrMetallicRoughness *param_1)

{
  PbrMetallicRoughness *param_1_local;
  PbrMetallicRoughness *this_local;
  
  std::vector<double,_std::allocator<double>_>::vector
            (&this->baseColorFactor,&param_1->baseColorFactor);
  TextureInfo::TextureInfo(&this->baseColorTexture,&param_1->baseColorTexture);
  this->metallicFactor = param_1->metallicFactor;
  this->roughnessFactor = param_1->roughnessFactor;
  TextureInfo::TextureInfo(&this->metallicRoughnessTexture,&param_1->metallicRoughnessTexture);
  Value::Value(&this->extras,&param_1->extras);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
  ::map(&this->extensions,&param_1->extensions);
  std::__cxx11::string::string
            ((string *)&this->extras_json_string,(string *)&param_1->extras_json_string);
  std::__cxx11::string::string
            ((string *)&this->extensions_json_string,(string *)&param_1->extensions_json_string);
  return;
}

Assistant:

PbrMetallicRoughness() = default;